

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O2

void __thiscall rcdiscover::SocketLinux::bindImpl(SocketLinux *this,sockaddr_in *addr)

{
  int iVar1;
  SocketException *this_00;
  int *piVar2;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = bind(this->sock_,(sockaddr *)addr,0x10);
  if (iVar1 != -1) {
    return;
  }
  this_00 = (SocketException *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Error while binding to socket",&local_39);
  piVar2 = __errno_location();
  SocketException::SocketException(this_00,&local_38,*piVar2);
  __cxa_throw(this_00,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

void SocketLinux::bindImpl(const ::sockaddr_in& addr)
{
  if (::bind(sock_,
             reinterpret_cast<const sockaddr *>(&addr),
             sizeof(sockaddr)) == -1)
  {
    throw SocketException("Error while binding to socket", errno);
  }
}